

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

Value * duckdb::MultiFileReader::CreateValueFromFileList
                  (Value *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *file_list)

{
  pointer pbVar1;
  pointer pcVar2;
  Value *pVVar3;
  pointer pbVar4;
  vector<duckdb::Value,_true> files;
  pointer local_c8;
  pointer pVStack_c0;
  pointer local_b8;
  Value *local_b0;
  string local_a8;
  vector<duckdb::Value,_true> local_88;
  Value local_70;
  
  local_c8 = (pointer)0x0;
  pVStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  pbVar4 = (file_list->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (file_list->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = __return_storage_ptr__;
  if (pbVar4 != pbVar1) {
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + pbVar4->_M_string_length);
      Value::Value(&local_70,&local_a8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  LogicalType::LogicalType(&local_70.type_,VARCHAR);
  pVVar3 = local_b0;
  local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_c8;
  local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_c0;
  local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_b8;
  local_c8 = (pointer)0x0;
  pVStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  Value::LIST(local_b0,&local_70.type_,&local_88);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
  LogicalType::~LogicalType(&local_70.type_);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
  return pVVar3;
}

Assistant:

Value MultiFileReader::CreateValueFromFileList(const vector<string> &file_list) {
	vector<Value> files;
	for (auto &file : file_list) {
		files.push_back(file);
	}
	return Value::LIST(LogicalType::VARCHAR, std::move(files));
}